

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# radix_partitioning.cpp
# Opt level: O3

void __thiscall
duckdb::RadixPartitionedColumnData::ComputePartitionIndices
          (RadixPartitionedColumnData *this,PartitionedColumnDataAppendState *state,DataChunk *input
          )

{
  idx_t radix_bits;
  reference args;
  SelectionVector *args_3;
  idx_t local_38;
  idx_t local_30;
  
  radix_bits = this->radix_bits;
  args = vector<duckdb::Vector,_true>::operator[](&input->data,this->hash_col_idx);
  local_30 = input->count;
  args_3 = FlatVector::IncrementalSelectionVector();
  local_38 = input->count;
  RadixBitsSwitch<duckdb::ComputePartitionIndicesFunctor,void,duckdb::Vector&,duckdb::Vector&,unsigned_long,duckdb::SelectionVector_const&,unsigned_long>
            (radix_bits,args,&state->partition_indices,&local_30,args_3,&local_38);
  return;
}

Assistant:

void RadixPartitionedColumnData::ComputePartitionIndices(PartitionedColumnDataAppendState &state, DataChunk &input) {
	D_ASSERT(partitions.size() == RadixPartitioning::NumberOfPartitions(radix_bits));
	D_ASSERT(state.partition_buffers.size() == RadixPartitioning::NumberOfPartitions(radix_bits));
	RadixBitsSwitch<ComputePartitionIndicesFunctor, void>(radix_bits, input.data[hash_col_idx], state.partition_indices,
	                                                      input.size(), *FlatVector::IncrementalSelectionVector(),
	                                                      input.size());
}